

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O2

RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::RealSchur<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
computeFromHessenberg<Eigen::internal::HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          *matrixH,Matrix<double,__1,__1,_0,__1,__1> *matrixQ,bool computeU)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  Index IVar4;
  Index il;
  undefined7 in_register_00000009;
  long lVar5;
  long lVar6;
  long lVar7;
  Scalar SVar8;
  Scalar exshift;
  Index im;
  Scalar considerAsZero;
  Vector3s firstHouseholderVector;
  Vector3s shiftInfo;
  long local_88;
  Scalar local_80;
  Scalar *local_78;
  Index local_70;
  double local_68;
  Vector3s local_60;
  Vector3s local_48;
  
  PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
             (ReturnByValue<Eigen::internal::HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)matrixH);
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x30),
             *(Index *)(this + 0x10));
  if (((int)CONCAT71(in_register_00000009,computeU) != 0) &&
     ((*(double **)(this + 0x18) !=
       (matrixQ->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
      || (*(long *)(this + 0x20) !=
          (matrixQ->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows)))) {
    internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)(this + 0x18),matrixQ);
  }
  local_88 = *(long *)(this + 0x88);
  if (local_88 == -1) {
    IVar4 = internal::
            HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
            rows(matrixH);
    local_88 = IVar4 * 0x28;
  }
  lVar7 = *(long *)(this + 0x10);
  local_78 = *(Scalar **)(this + 0x30);
  local_80 = 0.0;
  SVar8 = RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::computeNormOfT
                    ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  local_68 = 2.2250738585072014e-308;
  if (2.2250738585072014e-308 <= SVar8 * 4.930380657631324e-32) {
    local_68 = SVar8 * 4.930380657631324e-32;
  }
  lVar5 = 0;
  if ((0 < lVar7) && ((SVar8 != 0.0 || (NAN(SVar8))))) {
    lVar7 = lVar7 + -1;
    lVar6 = 0;
    lVar5 = 0;
    do {
      il = RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::findSmallSubdiagEntry
                     ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,lVar7,&local_68);
      if (il == lVar7) {
        lVar1 = *(long *)this;
        lVar2 = *(long *)(this + 8);
        lVar6 = lVar1 + lVar2 * lVar7 * 8;
        *(double *)(lVar6 + lVar7 * 8) = *(double *)(lVar6 + lVar7 * 8) + local_80;
        if (lVar7 < 1) break;
        *(undefined8 *)(lVar1 + lVar2 * (lVar7 + -1) * 8 + lVar7 * 8) = 0;
        bVar3 = true;
        lVar6 = 0;
        lVar7 = lVar7 + -1;
      }
      else if (il == lVar7 + -1) {
        RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::splitOffTwoRows
                  ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,lVar7,computeU,
                   &local_80);
        lVar7 = lVar7 + -2;
        bVar3 = true;
        lVar6 = 0;
      }
      else {
        DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
        PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_60,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)&local_48);
        RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::computeShift
                  ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,lVar7,lVar6,
                   &local_80,&local_48);
        bVar3 = lVar5 < local_88;
        if (lVar5 < local_88) {
          RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::initFrancisQRStep
                    ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,il,lVar7,&local_48
                     ,&local_70,&local_60);
          RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::performFrancisQRStep
                    ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,il,local_70,lVar7,
                     computeU,&local_60,local_78);
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 1;
      }
      if ((!bVar3) || (lVar7 < 0)) break;
    } while( true );
  }
  *(uint *)(this + 0x80) = (uint)(local_88 < lVar5) * 2;
  this[0x84] = (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x1;
  this[0x85] = (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>>)computeU;
  return (RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
}

Assistant:

RealSchur<MatrixType>& RealSchur<MatrixType>::computeFromHessenberg(const HessMatrixType& matrixH, const OrthMatrixType& matrixQ,  bool computeU)
{
  using std::abs;

  m_matT = matrixH;
  m_workspaceVector.resize(m_matT.cols());
  if(computeU && !internal::is_same_dense(m_matU,matrixQ))
    m_matU = matrixQ;
  
  Index maxIters = m_maxIters;
  if (maxIters == -1)
    maxIters = m_maxIterationsPerRow * matrixH.rows();
  Scalar* workspace = &m_workspaceVector.coeffRef(0);

  // The matrix m_matT is divided in three parts. 
  // Rows 0,...,il-1 are decoupled from the rest because m_matT(il,il-1) is zero. 
  // Rows il,...,iu is the part we are working on (the active window).
  // Rows iu+1,...,end are already brought in triangular form.
  Index iu = m_matT.cols() - 1;
  Index iter = 0;      // iteration count for current eigenvalue
  Index totalIter = 0; // iteration count for whole matrix
  Scalar exshift(0);   // sum of exceptional shifts
  Scalar norm = computeNormOfT();
  // sub-diagonal entries smaller than considerAsZero will be treated as zero.
  // We use eps^2 to enable more precision in small eigenvalues.
  Scalar considerAsZero = numext::maxi<Scalar>( norm * numext::abs2(NumTraits<Scalar>::epsilon()),
                                                (std::numeric_limits<Scalar>::min)() );

  if(norm!=Scalar(0))
  {
    while (iu >= 0)
    {
      Index il = findSmallSubdiagEntry(iu,considerAsZero);

      // Check for convergence
      if (il == iu) // One root found
      {
        m_matT.coeffRef(iu,iu) = m_matT.coeff(iu,iu) + exshift;
        if (iu > 0)
          m_matT.coeffRef(iu, iu-1) = Scalar(0);
        iu--;
        iter = 0;
      }
      else if (il == iu-1) // Two roots found
      {
        splitOffTwoRows(iu, computeU, exshift);
        iu -= 2;
        iter = 0;
      }
      else // No convergence yet
      {
        // The firstHouseholderVector vector has to be initialized to something to get rid of a silly GCC warning (-O1 -Wall -DNDEBUG )
        Vector3s firstHouseholderVector = Vector3s::Zero(), shiftInfo;
        computeShift(iu, iter, exshift, shiftInfo);
        iter = iter + 1;
        totalIter = totalIter + 1;
        if (totalIter > maxIters) break;
        Index im;
        initFrancisQRStep(il, iu, shiftInfo, im, firstHouseholderVector);
        performFrancisQRStep(il, im, iu, computeU, firstHouseholderVector, workspace);
      }
    }
  }
  if(totalIter <= maxIters)
    m_info = Success;
  else
    m_info = NoConvergence;

  m_isInitialized = true;
  m_matUisUptodate = computeU;
  return *this;
}